

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::RoundEven::~RoundEven(RoundEven *this)

{
  RoundEven *this_local;
  
  ~RoundEven(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

RoundEven (void) : PreciseFunc1("roundEven", deRoundEven) {}